

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

ostream * L12_1::operator<<(ostream *os,String *str)

{
  char *__s;
  size_t sVar1;
  
  __s = str->_p_str;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream &os, const String &str) {
        os << str._p_str;
        return os;
    }